

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astVariableDefinitionNode_createMacro
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t nameExpression,
          sysbvm_tuple_t typeExpression,sysbvm_tuple_t valueExpression)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_astVariableDefinitionNode_t *result;
  sysbvm_tuple_t valueExpression_local;
  sysbvm_tuple_t typeExpression_local;
  sysbvm_tuple_t nameExpression_local;
  sysbvm_tuple_t sourcePosition_local;
  sysbvm_context_t *context_local;
  
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).astVariableDefinitionNodeType,0xd);
  (psVar1->field_1).pointers[0] = sourcePosition;
  psVar1[1].field_1.pointers[0] = nameExpression;
  psVar1[2].header.field_0.typePointer = typeExpression;
  psVar1[2].header.identityHashAndFlags = (int)valueExpression;
  psVar1[2].header.objectSize = (int)(valueExpression >> 0x20);
  psVar1[3].header.field_0.typePointer = 0x1f;
  psVar1[3].header.identityHashAndFlags = 0xf;
  psVar1[3].header.objectSize = 0;
  psVar1[3].field_1.pointers[0] = 0xf;
  psVar1[4].header.field_0.typePointer = 0xf;
  psVar1[4].header.identityHashAndFlags = 0xf;
  psVar1[4].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_astVariableDefinitionNode_createMacro(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t nameExpression, sysbvm_tuple_t typeExpression, sysbvm_tuple_t valueExpression)
{
    sysbvm_astVariableDefinitionNode_t *result = (sysbvm_astVariableDefinitionNode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.astVariableDefinitionNodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_astVariableDefinitionNode_t));
    result->super.sourcePosition = sourcePosition;
    result->nameExpression = nameExpression;
    result->typeExpression = typeExpression;
    result->valueExpression = valueExpression;
    result->isMacroSymbol = SYSBVM_TRUE_TUPLE;
    result->isMutable = SYSBVM_FALSE_TUPLE;
    result->isPublic = SYSBVM_FALSE_TUPLE;
    result->isExternal = SYSBVM_FALSE_TUPLE;
    result->isThreadLocal = SYSBVM_FALSE_TUPLE;
    return (sysbvm_tuple_t)result;
}